

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void swrenderer::rt_draw4cols(int sx)

{
  uint uVar1;
  int *piVar2;
  uint *puVar3;
  DFrameBuffer *pDVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long *plVar9;
  uint uVar10;
  int drawcount;
  uint uVar11;
  int iVar12;
  
  pDVar4 = screen;
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
    piVar2 = *(int **)((long)&drawerargs::dc_ctspan + lVar5);
    *piVar2 = (pDVar4->super_DSimpleCanvas).super_DCanvas.Height + 1;
    piVar2[1] = (pDVar4->super_DSimpleCanvas).super_DCanvas.Height;
  }
  lVar5 = 0;
  uVar7 = 0;
  uVar6 = 0xffffffff;
  do {
    while( true ) {
      for (; plVar9 = (long *)&drawerargs::horizspan, lVar5 != 4; lVar5 = lVar5 + 1) {
        if ((&drawerargs::horizspan)[lVar5] < (ulong)(&drawerargs::dc_ctspan)[lVar5]) {
          uVar1 = *(uint *)((long)(&drawerargs::horizspan)[lVar5] + 8);
          if (uVar1 < uVar6) {
            uVar6 = uVar1;
          }
        }
        else {
          uVar7 = uVar7 | 1 << ((uint)lVar5 & 0x1f);
        }
      }
      if (uVar7 == 0xf) {
        return;
      }
      uVar1 = *DAT_0075b9d8;
      if (*DAT_0075b9d8 < *drawerargs::horizspan) {
        uVar1 = *drawerargs::horizspan;
      }
      uVar11 = *DAT_0075b9e8;
      if (*DAT_0075b9e8 < *DAT_0075b9e0) {
        uVar11 = *DAT_0075b9e0;
      }
      if (uVar11 < uVar1) {
        uVar11 = uVar1;
      }
      uVar1 = DAT_0075b9d8[1];
      if (drawerargs::horizspan[1] < DAT_0075b9d8[1]) {
        uVar1 = drawerargs::horizspan[1];
      }
      uVar10 = DAT_0075b9e8[1];
      if (DAT_0075b9e0[1] < DAT_0075b9e8[1]) {
        uVar10 = DAT_0075b9e0[1];
      }
      if (uVar1 < uVar10) {
        uVar10 = uVar1;
      }
      if ((uVar7 != 0) || (uVar10 < uVar11)) break;
      for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
        if (*(uint *)*plVar9 < uVar11) {
          (*hcolfunc_post1)(uVar8 & 0xffffffff,sx + (int)uVar8);
        }
        plVar9 = plVar9 + 1;
      }
      (*hcolfunc_post4)(sx,uVar11,uVar10);
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
        piVar2 = *(int **)((long)&drawerargs::horizspan + lVar5);
        if (uVar10 < (uint)piVar2[1]) {
          *piVar2 = uVar10 + 1;
        }
        else {
          *(int **)((long)&drawerargs::horizspan + lVar5) = piVar2 + 2;
        }
      }
      lVar5 = 0;
      uVar7 = 0;
      uVar6 = 0xffffffff;
    }
    iVar12 = 0;
    for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
      if ((uVar7 & 1) == 0) {
        puVar3 = (uint *)*plVar9;
        if (puVar3[1] < uVar6) {
          (*hcolfunc_post1)(uVar8 & 0xffffffff,sx + (int)uVar8,*puVar3);
          *plVar9 = *plVar9 + 8;
        }
        else {
          if (uVar6 <= *puVar3) goto LAB_002fa5d8;
          (*hcolfunc_post1)(uVar8 & 0xffffffff,sx + (int)uVar8,*puVar3,uVar6 - 1);
          *(uint *)*plVar9 = uVar6;
        }
        iVar12 = iVar12 + 1;
      }
LAB_002fa5d8:
      uVar7 = (int)uVar7 >> 1;
      plVar9 = plVar9 + 1;
    }
    lVar5 = 0;
    uVar7 = 0;
    uVar6 = 0xffffffff;
    if (iVar12 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void rt_draw4cols(int sx)
	{
		using namespace drawerargs;

		int x, bad;
		unsigned int maxtop, minbot, minnexttop;

		// Place a dummy "span" in each column. These don't get
		// drawn. They're just here to avoid special cases in the
		// max/min calculations below.
		for (x = 0; x < 4; ++x)
		{
			dc_ctspan[x][0] = screen->GetHeight()+1;
			dc_ctspan[x][1] = screen->GetHeight();
		}

		for (;;)
		{
			// If a column is out of spans, mark it as such
			bad = 0;
			minnexttop = 0xffffffff;
			for (x = 0; x < 4; ++x)
			{
				if (horizspan[x] >= dc_ctspan[x])
				{
					bad |= 1 << x;
				}
				else if ((horizspan[x]+2)[0] < minnexttop)
				{
					minnexttop = (horizspan[x]+2)[0];
				}
			}
			// Once all columns are out of spans, we're done
			if (bad == 15)
			{
				return;
			}

			// Find the largest shared area for the spans in each column
			maxtop = MAX (MAX (horizspan[0][0], horizspan[1][0]),
						  MAX (horizspan[2][0], horizspan[3][0]));
			minbot = MIN (MIN (horizspan[0][1], horizspan[1][1]),
						  MIN (horizspan[2][1], horizspan[3][1]));

			// If there is no shared area with these spans, draw each span
			// individually and advance to the next spans until we reach a shared area.
			// However, only draw spans down to the highest span in the next set of
			// spans. If we allow the entire height of a span to be drawn, it could
			// prevent any more shared areas from being drawn in these four columns.
			//
			// Example: Suppose we have the following arrangement:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//			aB D
			//			aBcD
			//			aBcD
			//			aBc
			//
			// If we draw the entire height of the spans, we end up drawing this first:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B
			//
			// This leaves only the "a" and "c" columns to be drawn, and they are not
			// part of a shared area, but if we can include B and D with them, we can
			// get a shared area. So we cut off everything in the first set just
			// above the "a" column and end up drawing this first:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//
			// Then the next time through, we have the following arrangement with an
			// easily shared area to draw:
			//			aB D
			//			aBcD
			//			aBcD
			//			aBc
			if (bad != 0 || maxtop > minbot)
			{
				int drawcount = 0;
				for (x = 0; x < 4; ++x)
				{
					if (!(bad & 1))
					{
						if (horizspan[x][1] < minnexttop)
						{
							hcolfunc_post1 (x, sx+x, horizspan[x][0], horizspan[x][1]);
							horizspan[x] += 2;
							drawcount++;
						}
						else if (minnexttop > horizspan[x][0])
						{
							hcolfunc_post1 (x, sx+x, horizspan[x][0], minnexttop-1);
							horizspan[x][0] = minnexttop;
							drawcount++;
						}
					}
					bad >>= 1;
				}
				// Drawcount *should* always be non-zero. The reality is that some situations
				// can make this not true. Unfortunately, I'm not sure what those situations are.
				if (drawcount == 0)
				{
					return;
				}
				continue;
			}

			// Draw any span fragments above the shared area.
			for (x = 0; x < 4; ++x)
			{
				if (maxtop > horizspan[x][0])
				{
					hcolfunc_post1 (x, sx+x, horizspan[x][0], maxtop-1);
				}
			}

			// Draw the shared area.
			hcolfunc_post4 (sx, maxtop, minbot);

			// For each column, if part of the span is past the shared area,
			// set its top to just below the shared area. Otherwise, advance
			// to the next span in that column.
			for (x = 0; x < 4; ++x)
			{
				if (minbot < horizspan[x][1])
				{
					horizspan[x][0] = minbot+1;
				}
				else
				{
					horizspan[x] += 2;
				}
			}
		}
	}